

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O3

void __thiscall
GenericModelItem::insertRows(GenericModelItem *this,int row,QVector<GenericModelItem_*> *rows)

{
  QVector<GenericModelItem_*> *this_00;
  int iVar1;
  reference ppGVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  int iVar6;
  int iVar7;
  qsizetype n;
  long lVar8;
  ulong uVar9;
  
  n = (rows->d).size;
  lVar8 = (long)this->m_colCount * (long)row;
  this_00 = &this->children;
  iVar1 = (int)(this->children).d.size;
  iVar6 = iVar1 - (int)lVar8;
  iVar7 = (int)(n / (long)this->m_colCount);
  if (iVar6 != 0 && (int)lVar8 <= iVar1) {
    do {
      ppGVar2 = QList<GenericModelItem_*>::operator[](this_00,lVar8);
      (*ppGVar2)->m_row = (*ppGVar2)->m_row + iVar7;
      lVar8 = lVar8 + 1;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    n = (rows->d).size;
  }
  if (0 < (int)(uint)n) {
    uVar9 = 0;
    do {
      ppGVar2 = QList<GenericModelItem_*>::operator[](rows,uVar9);
      (*ppGVar2)->parent = this;
      iVar1 = this->m_colCount;
      ppGVar2 = QList<GenericModelItem_*>::operator[](rows,uVar9);
      (*ppGVar2)->m_row =
           (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                (long)iVar1) + row;
      uVar9 = uVar9 + 1;
    } while (((uint)n & 0x7fffffff) != uVar9);
    n = (rows->d).size;
  }
  if (n != 0) {
    QtPrivate::QPodArrayOps<GenericModelItem_*>::insert
              ((QPodArrayOps<GenericModelItem_*> *)this_00,(long)this->m_colCount * (long)row,n,
               (parameter_type)0x0);
  }
  iVar3 = QList<GenericModelItem_*>::begin(rows);
  iVar4 = QList<GenericModelItem_*>::end(rows);
  iVar5 = QList<GenericModelItem_*>::begin(this_00);
  lVar8 = (long)iVar4.i - (long)iVar3.i >> 3;
  if (0 < lVar8) {
    iVar1 = this->m_colCount;
    uVar9 = lVar8 + 1;
    lVar8 = 0;
    do {
      *(undefined8 *)((long)iVar5.i + lVar8 + (long)(row * iVar1) * 8) =
           *(undefined8 *)((long)iVar3.i + lVar8);
      uVar9 = uVar9 - 1;
      lVar8 = lVar8 + 8;
    } while (1 < uVar9);
  }
  this->m_rowCount = this->m_rowCount + iVar7;
  return;
}

Assistant:

void GenericModelItem::insertRows(int row, QVector<GenericModelItem *> rows)
{
    Q_ASSERT(row >= 0 && row <= m_rowCount);
    Q_ASSERT(!rows.isEmpty());
    Q_ASSERT(rows.count() % m_colCount == 0);
    const int count = rows.count() / m_colCount;
    for (int i = row * m_colCount, maxI = children.size(); i < maxI; ++i)
        children[i]->m_row += count;
    for (int i = 0, maxI = rows.size(); i < maxI; ++i) {
        rows[i]->parent = this;
        rows[i]->m_row = row + (i / m_colCount);
    }
    children.insert(row * m_colCount, rows.size(), nullptr);
    std::copy(rows.begin(), rows.end(), children.begin() + (row * m_colCount));
    m_rowCount += count;
#ifdef QT_DEBUG
    Q_ASSERT(m_colCount * m_rowCount == children.size());
    Q_ASSERT(std::all_of(children.constBegin(), children.constEnd(), [](GenericModelItem *item) -> bool { return item != nullptr; }));
    for (int i = 0; i < children.size(); ++i) {
        Q_ASSERT(children.at(i)->row() == i / m_colCount);
        Q_ASSERT(children.at(i)->column() == i % m_colCount);
    }
#endif
}